

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O3

void Fraig_FeedBackCheckTableF0(Fraig_Man_t *p)

{
  Fraig_HashTable_t *pFVar1;
  Fraig_Node_t **ppFVar2;
  int iVar3;
  Fraig_NodeVec_t *pFVar4;
  Fraig_NodeVec_t *pFVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Fraig_Node_t *Entry;
  long lVar10;
  
  pFVar1 = p->pTableF0;
  if (0 < pFVar1->nBins) {
    pFVar5 = p->vCones;
    lVar6 = 0;
    pFVar4 = pFVar5;
    do {
      pFVar4->nSize = 0;
      Entry = pFVar1->pBins[lVar6];
      if (Entry == (Fraig_Node_t *)0x0) {
LAB_005ef979:
        iVar3 = pFVar4->nSize;
        if (0 < iVar3) {
          lVar9 = 1;
          lVar7 = 0;
          do {
            lVar8 = lVar7 + 1;
            lVar10 = lVar9;
            if (lVar8 < iVar3) {
              do {
                iVar3 = Fraig_CompareSimInfo
                                  (pFVar4->pArray[lVar7],pFVar4->pArray[lVar10],p->iWordStart,0);
                if (iVar3 != 0) {
                  ppFVar2 = p->vCones->pArray;
                  printf("Nodes %d and %d have the same D simulation info.\n",
                         (ulong)(uint)ppFVar2[lVar7]->Num,(ulong)(uint)ppFVar2[lVar10]->Num);
                }
                lVar10 = lVar10 + 1;
                pFVar4 = p->vCones;
                iVar3 = pFVar4->nSize;
              } while ((int)lVar10 < iVar3);
            }
            else {
              iVar3 = pFVar5->nSize;
              pFVar4 = pFVar5;
            }
            lVar9 = lVar9 + 1;
            pFVar5 = pFVar4;
            lVar7 = lVar8;
          } while (lVar8 < iVar3);
        }
      }
      else {
        do {
          Fraig_NodeVecPush(p->vCones,Entry);
          Entry = Entry->pNextF;
        } while (Entry != (Fraig_Node_t *)0x0);
        pFVar4 = p->vCones;
        pFVar5 = pFVar4;
        if (pFVar4->nSize != 1) goto LAB_005ef979;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pFVar1->nBins);
  }
  return;
}

Assistant:

void Fraig_FeedBackCheckTableF0( Fraig_Man_t * p )
{
    Fraig_HashTable_t * pT = p->pTableF0;
    Fraig_Node_t * pEntF;
    int i, k, m, nPairs;

    nPairs = 0;
    for ( i = 0; i < pT->nBins; i++ )
    {
        p->vCones->nSize = 0;
        Fraig_TableBinForEachEntryF( pT->pBins[i], pEntF )
            Fraig_NodeVecPush( p->vCones, pEntF );
        if ( p->vCones->nSize == 1 )
            continue;
        for ( k = 0; k < p->vCones->nSize; k++ )
            for ( m = k+1; m < p->vCones->nSize; m++ )
            {
                if ( Fraig_CompareSimInfo( p->vCones->pArray[k], p->vCones->pArray[m], p->iWordStart, 0 ) )
                    printf( "Nodes %d and %d have the same D simulation info.\n", 
                        p->vCones->pArray[k]->Num, p->vCones->pArray[m]->Num );
                nPairs++;
            }   
    }
//    printf( "\nThe total of %d node pairs have been verified.\n", nPairs );
}